

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::ListTar(char *outFileName,bool verbose)

{
  bool bVar1;
  
  bVar1 = anon_unknown.dwarf_57c98f::extract_tar(outFileName,verbose,false);
  return bVar1;
}

Assistant:

bool cmSystemTools::ListTar(const char* outFileName, bool verbose)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  return extract_tar(outFileName, verbose, false);
#else
  (void)outFileName;
  (void)verbose;
  return false;
#endif
}